

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O2

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_test_unregister_works_with_different_object_Test::
SubjectSetRegisterTest_test_unregister_works_with_different_object_Test
          (SubjectSetRegisterTest_test_unregister_works_with_different_object_Test *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Test_00274128;
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_unregister_works_with_different_object)
{
    SubjectSetRegister subject_register = SubjectSetRegister();

    const Subject subject1 = SubjectUtils::CreateSubjectFromString(
            "SellSideAccount=CIC,SellSideAllocAccount=CIC,AllocQuantity=1000000,AssetClass=Fx,Currency=EUR"
            ",BuySideId=1A78668,Level=1,NumAllocs=1"
            ",Symbol=EURGBP,Quantity=1000000.00"
            ",RequestFor=Stream,LiquidityProvider=MSFX,DealType=Spot,Tenor=Spot,User=brucelee,SettlementDate=20141109");

    const Subject subject2 = SubjectUtils::CreateSubjectFromString(
            "SellSideAccount=CIC,SellSideAllocAccount=CIC,AllocQuantity=1000000,AssetClass=Fx,Currency=EUR"
            ",BuySideId=1A78668,Level=1,NumAllocs=1"
            ",Symbol=EURGBP,Quantity=1000000.00"
            ",RequestFor=Stream,LiquidityProvider=MSFX,DealType=Spot,Tenor=Spot,User=brucelee,SettlementDate=20141109");


    EXPECT_FALSE(subject_register.IsCurrentlySubscribed(subject1));
    EXPECT_FALSE(subject_register.IsCurrentlySubscribed(subject2));
    subject_register.Register(subject1, false);
    EXPECT_TRUE(subject_register.IsCurrentlySubscribed(subject1));
    EXPECT_TRUE(subject_register.IsCurrentlySubscribed(subject2));
    subject_register.Unregister(subject2);
    EXPECT_FALSE(subject_register.IsCurrentlySubscribed(subject1));
    EXPECT_FALSE(subject_register.IsCurrentlySubscribed(subject2));
}